

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O2

void duckdb::SortedAggregateFunction::ProjectInputs
               (Vector *inputs,SortedAggregateBindData *order_bind,idx_t input_count,idx_t count,
               DataChunk *arg_input,DataChunk *sort_input)

{
  Vector *pVVar1;
  pointer pVVar2;
  Vector *dst;
  Vector *pVVar3;
  long lVar4;
  Vector *dst_1;
  Vector *other;
  pointer this;
  
  if (order_bind->sorted_on_args == false) {
    DataChunk::InitializeEmpty(arg_input,&order_bind->arg_types);
    pVVar1 = (arg_input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar4 = 0;
    other = inputs;
    for (pVVar3 = (arg_input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start; pVVar3 != pVVar1; pVVar3 = pVVar3 + 1) {
      lVar4 = lVar4 + 1;
      Vector::Reference(pVVar3,other);
      other = other + 1;
    }
    arg_input->count = count;
  }
  else {
    lVar4 = 0;
  }
  DataChunk::InitializeEmpty(sort_input,&order_bind->sort_types);
  pVVar2 = (sort_input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar3 = inputs + lVar4;
  for (this = (sort_input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start; this != pVVar2; this = this + 1) {
    Vector::Reference(this,pVVar3);
    pVVar3 = pVVar3 + 1;
  }
  sort_input->count = count;
  return;
}

Assistant:

static void ProjectInputs(Vector inputs[], const SortedAggregateBindData &order_bind, idx_t input_count,
	                          idx_t count, DataChunk &arg_input, DataChunk &sort_input) {
		idx_t col = 0;

		if (!order_bind.sorted_on_args) {
			arg_input.InitializeEmpty(order_bind.arg_types);
			for (auto &dst : arg_input.data) {
				dst.Reference(inputs[col++]);
			}
			arg_input.SetCardinality(count);
		}

		sort_input.InitializeEmpty(order_bind.sort_types);
		for (auto &dst : sort_input.data) {
			dst.Reference(inputs[col++]);
		}
		sort_input.SetCardinality(count);
	}